

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsCheckIfNDefDefine.cxx
# Opt level: O0

bool __thiscall kws::Parser::CheckIfNDefDefine(Parser *this,char *match,bool uppercaseTheDefinition)

{
  Parser *pPVar1;
  int iVar2;
  long lVar3;
  char *pcVar4;
  ulong uVar5;
  ostream *this_00;
  reference pcVar6;
  byte in_DL;
  Parser *in_RSI;
  long in_RDI;
  bool bVar7;
  Error error;
  Error error_3;
  iterator it;
  long posnofc;
  string toMatch;
  string extension;
  string nameofclass;
  long slash;
  long point;
  string define;
  Error error_2;
  long posDef;
  string ifndef;
  long end;
  long begin;
  Error error_1;
  long definepos;
  long i;
  long pos;
  bool doesMatch;
  bool notDefined;
  bool hasError;
  long sup;
  long inf;
  string l;
  char *val;
  size_t length;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc50;
  value_type *in_stack_fffffffffffffc58;
  vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_> *in_stack_fffffffffffffc60;
  size_type in_stack_fffffffffffffc68;
  undefined1 uVar8;
  undefined7 in_stack_fffffffffffffc70;
  char in_stack_fffffffffffffc77;
  Parser *in_stack_fffffffffffffc78;
  string local_298 [32];
  string local_278 [32];
  value_type local_258;
  string local_220 [32];
  char *local_200;
  undefined8 local_1f8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1f0;
  ulong local_1e8;
  allocator local_1d9;
  string local_1d8 [32];
  string local_1b8 [32];
  string local_198 [32];
  undefined8 local_178;
  undefined8 local_170;
  string local_168 [32];
  long local_148;
  long local_140;
  undefined8 local_138;
  string local_130 [32];
  long local_110;
  string local_108 [32];
  long local_e8;
  long local_e0;
  int local_d4;
  long local_d0;
  long local_c8;
  undefined8 local_c0;
  string local_b8 [32];
  long local_98;
  long local_90;
  long local_88;
  byte local_7b;
  byte local_7a;
  byte local_79;
  ulong local_78;
  ulong local_70;
  allocator local_51;
  string local_50 [32];
  char *local_30;
  undefined8 local_28;
  byte local_19;
  Parser *local_18;
  byte local_1;
  
  local_19 = in_DL & 1;
  local_18 = in_RSI;
  lVar3 = std::__cxx11::string::find((char *)(in_RDI + 0x588),0x1e59ed);
  if (lVar3 == -1) {
    *(undefined1 *)(in_RDI + 0x3e) = 1;
    local_28 = 0x200;
    local_30 = (char *)operator_new__(0x200);
    snprintf(local_30,0x200,"#ifndef/#define should match ");
    std::__cxx11::string::operator=((string *)(in_RDI + 0x218),local_30);
    pPVar1 = local_18;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_50,(char *)pPVar1,&local_51);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    local_70 = std::__cxx11::string::find((char *)local_50,0x1e5c08);
    while (local_70 != 0xffffffffffffffff) {
      std::__cxx11::string::replace((ulong)local_50,local_70,(char *)0x1);
      local_70 = std::__cxx11::string::find((char *)local_50,0x1e5c08);
    }
    local_78 = std::__cxx11::string::find((char *)local_50,0x1e512a);
    while (local_78 != 0xffffffffffffffff) {
      std::__cxx11::string::replace((ulong)local_50,local_78,(char *)0x1);
      local_78 = std::__cxx11::string::find((char *)local_50,0x1e512a);
    }
    std::__cxx11::string::operator+=((string *)(in_RDI + 0x218),local_50);
    if (local_30 != (char *)0x0) {
      operator_delete__(local_30);
    }
    local_79 = 0;
    local_7a = 0;
    local_7b = 1;
    local_88 = std::__cxx11::string::find((char *)(in_RDI + 0x518),0x1e5a0e);
    if (local_88 == -1) {
      local_7a = 1;
    }
    else {
      for (local_90 = 0; local_90 < local_88; local_90 = local_90 + 1) {
        pcVar4 = (char *)std::__cxx11::string::operator[](in_RDI + 0x518);
        if (((*pcVar4 != ' ') &&
            (pcVar4 = (char *)std::__cxx11::string::operator[](in_RDI + 0x518), *pcVar4 != '\r')) &&
           (pcVar4 = (char *)std::__cxx11::string::operator[](in_RDI + 0x518), *pcVar4 != '\n')) {
          local_7a = 1;
        }
      }
    }
    uVar8 = (undefined1)(in_stack_fffffffffffffc68 >> 0x38);
    local_98 = local_88;
    if ((local_7a & 1) == 0) {
      do {
        uVar8 = (undefined1)(in_stack_fffffffffffffc68 >> 0x38);
        if (((local_7a ^ 0xff) & 1) == 0) {
          ErrorStruct::ErrorStruct((ErrorStruct *)0x1a29e6);
          GetLineNumber(in_stack_fffffffffffffc78,
                        CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70),(bool)uVar8);
          std::__cxx11::string::operator=(local_298,"#ifndef/#define does not match");
          std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
                    (in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
          local_1 = (local_79 ^ 0xff) & 1;
          local_d4 = 1;
          ErrorStruct::~ErrorStruct((ErrorStruct *)0x1a2a87);
          break;
        }
        local_7b = 1;
        local_88 = local_88 + 8;
        while (pcVar4 = (char *)std::__cxx11::string::operator[](in_RDI + 0x518), *pcVar4 == ' ') {
          local_88 = local_88 + 1;
        }
        local_e0 = local_88;
        while( true ) {
          pcVar4 = (char *)std::__cxx11::string::operator[](in_RDI + 0x518);
          bVar7 = false;
          if (*pcVar4 != ' ') {
            pcVar4 = (char *)std::__cxx11::string::operator[](in_RDI + 0x518);
            bVar7 = false;
            if (*pcVar4 != '\r') {
              pcVar4 = (char *)std::__cxx11::string::operator[](in_RDI + 0x518);
              bVar7 = *pcVar4 != '\n';
            }
          }
          if (!bVar7) break;
          local_88 = local_88 + 1;
        }
        local_e8 = local_88;
        std::__cxx11::string::substr((ulong)local_108,in_RDI + 0x518);
        local_110 = std::__cxx11::string::find((char *)(in_RDI + 0x518),0x1e5a2a);
        if (local_110 == -1) {
          ErrorStruct::ErrorStruct((ErrorStruct *)0x1a2192);
          local_148 = GetLineNumber(in_stack_fffffffffffffc78,
                                    CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70),
                                    SUB81(in_stack_fffffffffffffc68 >> 0x38,0));
          local_138 = 0xe;
          local_140 = local_148;
          std::__cxx11::string::operator=(local_130,"#define not defined");
          std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
                    (in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
          local_1 = 0;
          local_d4 = 1;
          ErrorStruct::~ErrorStruct((ErrorStruct *)0x1a222f);
        }
        else {
          local_110 = local_110 + 7;
          while (pcVar4 = (char *)std::__cxx11::string::operator[](in_RDI + 0x518), *pcVar4 == ' ')
          {
            local_110 = local_110 + 1;
          }
          local_e0 = local_110;
          while( true ) {
            pcVar4 = (char *)std::__cxx11::string::operator[](in_RDI + 0x518);
            bVar7 = false;
            if (*pcVar4 != ' ') {
              pcVar4 = (char *)std::__cxx11::string::operator[](in_RDI + 0x518);
              bVar7 = false;
              if (*pcVar4 != '\r') {
                pcVar4 = (char *)std::__cxx11::string::operator[](in_RDI + 0x518);
                bVar7 = *pcVar4 != '\n';
              }
            }
            if (!bVar7) break;
            local_110 = local_110 + 1;
          }
          local_e8 = local_110;
          std::__cxx11::string::substr((ulong)local_168,in_RDI + 0x518);
          bVar7 = std::operator!=(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
          if (bVar7) {
            local_7b = 0;
          }
          if ((local_7b & 1) == 0) {
            local_88 = std::__cxx11::string::find((char *)(in_RDI + 0x518),0x1e5a0e);
            if (local_88 == -1) {
              local_7a = 1;
            }
            local_d4 = 0;
          }
          else {
            uVar5 = std::__cxx11::string::empty();
            if ((uVar5 & 1) == 0) {
              pcVar4 = (char *)(in_RDI + 0x588);
              local_170 = std::__cxx11::string::find_last_of(pcVar4,0x1e4d84);
              local_178 = std::__cxx11::string::find_last_of(pcVar4,0x1d8c59);
              std::__cxx11::string::substr((ulong)local_198,(ulong)pcVar4);
              std::__cxx11::string::size();
              std::__cxx11::string::substr((ulong)local_1b8,in_RDI + 0x588);
              in_stack_fffffffffffffc78 = local_18;
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_1d8,(char *)in_stack_fffffffffffffc78,&local_1d9);
              std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
              local_1e8 = std::__cxx11::string::find((char *)local_1d8,0x1e5a75);
              if (local_1e8 != 0xffffffffffffffff) {
                std::__cxx11::string::replace((ulong)local_1d8,local_1e8,(string *)0xd);
              }
              local_1e8 = std::__cxx11::string::find((char *)local_1d8,0x1d7482);
              if (local_1e8 != 0xffffffffffffffff) {
                std::__cxx11::string::replace((ulong)local_1d8,local_1e8,(string *)0xb);
              }
              if ((local_19 & 1) != 0) {
                local_1f0._M_current = (char *)std::__cxx11::string::begin();
                while( true ) {
                  local_1f8 = std::__cxx11::string::end();
                  bVar7 = __gnu_cxx::operator!=
                                    ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)in_stack_fffffffffffffc50,
                                     (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)in_stack_fffffffffffffc48);
                  if (!bVar7) break;
                  pcVar6 = __gnu_cxx::
                           __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ::operator*(&local_1f0);
                  iVar2 = toupper((int)*pcVar6);
                  in_stack_fffffffffffffc77 = (char)iVar2;
                  pcVar6 = __gnu_cxx::
                           __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ::operator*(&local_1f0);
                  *pcVar6 = in_stack_fffffffffffffc77;
                  local_200 = (char *)__gnu_cxx::
                                      __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::operator++((
                                                  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)in_stack_fffffffffffffc58,
                                                  (int)((ulong)in_stack_fffffffffffffc50 >> 0x20));
                }
              }
              bVar7 = std::operator!=(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
              uVar8 = (undefined1)(in_stack_fffffffffffffc68 >> 0x38);
              if (bVar7) {
                ErrorStruct::ErrorStruct((ErrorStruct *)0x1a276d);
                in_stack_fffffffffffffc68 =
                     GetLineNumber(in_stack_fffffffffffffc78,
                                   CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70),
                                   (bool)uVar8);
                local_258.description._M_string_length = in_stack_fffffffffffffc68;
                in_stack_fffffffffffffc60 =
                     (vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_> *)
                     GetLineNumber(in_stack_fffffffffffffc78,
                                   CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70),
                                   SUB81(in_stack_fffffffffffffc68 >> 0x38,0));
                local_258.description.field_2._8_8_ = 0xe;
                local_258.description.field_2._M_allocated_capacity =
                     (size_type)in_stack_fffffffffffffc60;
                std::__cxx11::string::operator=
                          (local_220,"#ifndef/#define does not match expression");
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffffc78,
                               (char *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70)
                              );
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffffc58,in_stack_fffffffffffffc50);
                in_stack_fffffffffffffc58 = &local_258;
                std::__cxx11::string::operator=(local_220,(string *)in_stack_fffffffffffffc58);
                std::__cxx11::string::~string((string *)in_stack_fffffffffffffc58);
                std::__cxx11::string::~string(local_278);
                std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
                          (in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
                local_1 = 0;
                local_d4 = 1;
                ErrorStruct::~ErrorStruct((ErrorStruct *)0x1a2890);
              }
              else {
                local_1 = 1;
                local_d4 = 1;
              }
              std::__cxx11::string::~string(local_1d8);
              std::__cxx11::string::~string(local_1b8);
              std::__cxx11::string::~string(local_198);
            }
            else {
              this_00 = std::operator<<((ostream *)&std::cout,
                                        "CheckIfNDefDefine() : m_Filename should be set");
              std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
              local_1 = 0;
              local_d4 = 1;
            }
          }
          std::__cxx11::string::~string(local_168);
        }
        std::__cxx11::string::~string(local_108);
      } while (local_d4 == 0);
    }
    else {
      ErrorStruct::ErrorStruct((ErrorStruct *)0x1a1ed8);
      local_d0 = GetLineNumber(in_stack_fffffffffffffc78,
                               CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70),
                               (bool)uVar8);
      local_c0 = 0xe;
      local_c8 = local_d0;
      std::__cxx11::string::operator=(local_b8,"#ifndef not defined");
      std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
                (in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
      local_1 = 0;
      local_d4 = 1;
      ErrorStruct::~ErrorStruct((ErrorStruct *)0x1a1f71);
    }
    std::__cxx11::string::~string(local_50);
  }
  else {
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool Parser::CheckIfNDefDefine(const char* match, bool uppercaseTheDefinition)
{
  // Check only if we are not a .cxx or .cc or .c file
  if(m_Filename.find(".c") != std::string::npos)
    {
    return false;
    }

  m_TestsDone[NDEFINE] = true;
  constexpr size_t length = 512;
  char* val = new char[length];
  snprintf(val,length,"#ifndef/#define should match ");
  m_TestsDescription[NDEFINE] = val;
  // Replace < and >
  std::string l = match;
  auto inf = static_cast<long int>(l.find("<", 0));
  while(inf != -1)
    {
    l.replace(inf,1,"&lt;");
    inf = static_cast<long int>(l.find("<",0));
    }

    auto sup = static_cast<long int>(l.find(">", 0));
    while (sup != -1) {
      l.replace(sup, 1, "&gt;");
      sup = static_cast<long int>(l.find(">", 0));
    }
  m_TestsDescription[NDEFINE] += l;
  delete [] val;

  bool hasError = false;
  bool notDefined = false;


  // We should have a #ifndef/#define on the same line and we go
  // through the file until we find a correct match.
  bool doesMatch = true;

  // Find the #ifndef word in the file
  auto pos = static_cast<long int>(m_BufferNoComment.find("#ifndef", 0));
  if(pos == -1)
    {
    notDefined = true;
    }
  else
    {
    for(long int i=0;i<pos;i++)
      {
      if((m_BufferNoComment[i] != ' ')
        && (m_BufferNoComment[i] != '\r')
        && (m_BufferNoComment[i] != '\n')
        )
        {
        notDefined = true;
        }
      }
    }

  long int definepos = pos;

  if(notDefined)
    {
    Error error;
    error.line = this->GetLineNumber(0,true);
    error.line2 = error.line;
    error.number = NDEFINE;
    error.description = "#ifndef not defined";
    m_ErrorList.push_back(error);
    return false;
    }

  while(!notDefined)
    {
    doesMatch = true;

    // Find the word after #ifndef
    pos += 8;
   
    while(m_BufferNoComment[pos] == ' ')
      {
      pos++;
      }
    long int begin = pos;
    while((m_BufferNoComment[pos] != ' ') 
      &&(m_BufferNoComment[pos] != '\r')
      &&(m_BufferNoComment[pos] != '\n')
      )
      {
      pos++;
      }
    long int end = pos;
    std::string ifndef = m_BufferNoComment.substr(begin,end-begin);

    // Find the word after #define
    auto posDef = static_cast<long int>(m_BufferNoComment.find("#define", end));

    if(posDef == -1)
      {
      Error error;
      error.line = this->GetLineNumber(end,true);
      error.line2 = error.line;
      error.number = NDEFINE;
      error.description = "#define not defined";
      m_ErrorList.push_back(error);
      return false;
      }
    
    posDef += 7; 
    while(m_BufferNoComment[posDef] == ' ')
      {
      posDef++;
      }
    begin = posDef;
    while((m_BufferNoComment[posDef] != ' ') 
      &&(m_BufferNoComment[posDef] != '\r')
      &&(m_BufferNoComment[posDef] != '\n')
      )
      {
      posDef++;
      }
    end = posDef;
    std::string define = m_BufferNoComment.substr(begin,end-begin);

    if(ifndef != define)
      {
      doesMatch = false;
      }

    if(doesMatch)
      {
      if (m_Filename.empty()) {
        std::cout << "CheckIfNDefDefine() : m_Filename should be set" << std::endl;
        return false;
      }

      auto point = static_cast<long int>(m_Filename.find_last_of("."));
      auto slash = static_cast<long int>(m_Filename.find_last_of("/"));

      std::string nameofclass = m_Filename.substr(slash+1,point-slash-1);
      std::string extension = m_Filename.substr(point+1,m_Filename.size()-point-1);

      // construct the string
      std::string toMatch = match;
      auto posnofc = static_cast<long int>(toMatch.find("[NameOfClass]"));
      if(posnofc != -1)
        {
        toMatch.replace(posnofc,13,nameofclass);
        }
      posnofc = static_cast<long int>(toMatch.find("[Extension]"));
      if(posnofc != -1)
        {
        toMatch.replace(posnofc,11,extension);
        }

      if(uppercaseTheDefinition)
        {
        for(std::string::iterator it = toMatch.begin(); it != toMatch.end(); it++)
          *it = static_cast<char>(std::toupper(*it));
        }

      if(ifndef != toMatch)
        {   
        Error error;
        error.line = this->GetLineNumber(definepos,true);
        error.line2 = this->GetLineNumber(end,true);
        error.number = NDEFINE;
        error.description = "#ifndef/#define does not match expression";
        error.description = ifndef+" v.s. "+toMatch;
        m_ErrorList.push_back(error);
        return false;
        }
      else
        {
        return true;
        }
      }

    pos = static_cast<long int>(m_BufferNoComment.find("#ifndef",pos+1));

    if(pos == -1)
      {
      notDefined = true;
      }
    /*else
      {
      for(int i=0;i<pos;i++)
        {
        if((m_BufferNoComment[i] != ' ')
          && (m_BufferNoComment[i] != '\r')
          && (m_BufferNoComment[i] != '\n')
          )
          {
          std::cout << "Not defined!" << std::endl;
          notDefined = true;
          }
        }
      }*/

    } // end looking for entire file


    Error error;
    error.line = this->GetLineNumber(definepos,true);
    error.line2 = error.line;
    error.number = NDEFINE;
    error.description = "#ifndef/#define does not match";
    m_ErrorList.push_back(error);

  return !hasError;
}